

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall
LoopCrosser::CellCrossesCell(LoopCrosser *this,S2ClippedShape *a_clipped,S2ClippedShape *b_clipped)

{
  double dVar1;
  double dVar2;
  int i;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  ulong uVar8;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar9;
  S2Point *pSVar10;
  S2Point *pSVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  if (*(uint *)&a_clipped->field_0x4 < 2) {
    bVar14 = false;
  }
  else {
    uVar8 = (ulong)(*(uint *)&a_clipped->field_0x4 >> 1);
    bVar14 = true;
    uVar12 = 1;
    lVar13 = 0;
    do {
      paVar9 = &a_clipped->field_3;
      if (5 < *(uint *)&a_clipped->field_0x4) {
        paVar9 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(a_clipped->field_3).edges_;
      }
      i = *(int *)((long)paVar9 + lVar13);
      pSVar10 = S2Loop::vertex(this->a_,i);
      pSVar11 = S2Loop::vertex(this->a_,i + 1);
      (this->crosser_).a_ = pSVar10;
      (this->crosser_).b_ = pSVar11;
      dVar1 = pSVar11->c_[0];
      dVar2 = pSVar10->c_[0];
      dVar3 = pSVar10->c_[1];
      dVar4 = pSVar10->c_[2];
      dVar5 = pSVar11->c_[1];
      dVar6 = pSVar11->c_[2];
      (this->crosser_).a_cross_b_.c_[0] = dVar6 * dVar3 - dVar4 * dVar5;
      (this->crosser_).a_cross_b_.c_[1] = dVar1 * dVar4 - dVar2 * dVar6;
      (this->crosser_).a_cross_b_.c_[2] = dVar5 * dVar2 - dVar3 * dVar1;
      (this->crosser_).have_tangents_ = false;
      (this->crosser_).c_ = (S2Point *)0x0;
      this->aj_ = i;
      this->bj_prev_ = -2;
      bVar7 = EdgeCrossesCell(this,b_clipped);
      if (bVar7) {
        return bVar14;
      }
      bVar14 = uVar12 < uVar8;
      lVar13 = lVar13 + 4;
      uVar12 = uVar12 + 1;
    } while (uVar8 * 4 != lVar13);
  }
  return bVar14;
}

Assistant:

bool LoopCrosser::CellCrossesCell(const S2ClippedShape& a_clipped,
                                  const S2ClippedShape& b_clipped) {
  // Test all edges of "a_clipped" against all edges of "b_clipped".
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    StartEdge(a_clipped.edge(i));
    if (EdgeCrossesCell(b_clipped)) return true;
  }
  return false;
}